

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

bool __thiscall
ddd::DaTrie<false,_false,_true>::search_prefix(DaTrie<false,_false,_true> *this,Query *query)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  const_reference pvVar6;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t child_pos;
  uint32_t base;
  undefined8 in_stack_ffffffffffffffc8;
  
  while( true ) {
    uVar3 = Query::node_pos(in_RSI);
    pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
    bVar1 = Bc::is_leaf(pvVar6);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      uVar3 = Query::node_pos(in_RSI);
      pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
      uVar3 = Bc::value(pvVar6);
      Query::set_value(in_RSI,uVar3);
      return true;
    }
    uVar3 = Query::node_pos(in_RSI);
    pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
    uVar3 = Bc::base(pvVar6);
    if (uVar3 == 0x7fffffff) break;
    bVar2 = Query::label(in_RSI);
    pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       (in_RDI,(ulong)(uVar3 ^ bVar2));
    uVar4 = Bc::check(pvVar6);
    uVar5 = Query::node_pos(in_RSI);
    if (uVar4 != uVar5) {
      return false;
    }
    Query::next((Query *)CONCAT44(uVar4,uVar3),(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20))
    ;
  }
  return false;
}

Assistant:

bool search_prefix(Query& query) const {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(Prefix);

    while (!bc_[query.node_pos()].is_leaf()) {
      auto base = bc_[query.node_pos()].base();
      if (base == INVALID_VALUE) {
        return false;
      }
      auto child_pos = base ^query.label();
      if (bc_[child_pos].check() != query.node_pos()) {
        return false;
      }
      query.next(child_pos);
    }

    query.set_value(bc_[query.node_pos()].value());
    return true;
  }